

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

void QGuiApplicationPrivate::processScreenLogicalDotsPerInchChange(ScreenLogicalDotsPerInchEvent *e)

{
  QPointer<QScreen> *this;
  long lVar1;
  Data *pDVar2;
  QScreenPrivate *this_00;
  QWindow *this_01;
  double dVar3;
  char cVar4;
  bool bVar5;
  iterator iVar6;
  iterator iVar7;
  QObject *pQVar8;
  long lVar9;
  QObject *pQVar10;
  undefined8 *puVar11;
  UpdateEmitter *pUVar12;
  long in_FS_OFFSET;
  byte bVar13;
  UpdateEmitter updateEmitter;
  
  bVar13 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = QCoreApplication::startingUp();
  if (cVar4 == '\0') {
    QHighDpiScaling::updateHighDpiScaling();
    this = &e->screen;
    bVar5 = QPointer::operator_cast_to_bool((QPointer *)this);
    if (bVar5) {
      pDVar2 = (this->wp).d;
      if ((pDVar2 == (Data *)0x0) ||
         ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
        pQVar8 = (QObject *)0x0;
      }
      else {
        pQVar8 = (e->screen).wp.value;
      }
      puVar11 = &DAT_005cf440;
      pUVar12 = &updateEmitter;
      for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
        *(undefined8 *)pUVar12 = *puVar11;
        puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
        pUVar12 = (UpdateEmitter *)((long)pUVar12 + ((ulong)bVar13 * -2 + 1) * 8);
      }
      QScreenPrivate::UpdateEmitter::UpdateEmitter(&updateEmitter,(QScreen *)pQVar8);
      this_00 = *(QScreenPrivate **)(pQVar8 + 8);
      dVar3 = e->dpiY;
      (this_00->super_QScreenData).logicalDpi.first = e->dpiX;
      (this_00->super_QScreenData).logicalDpi.second = dVar3;
      QScreenPrivate::updateGeometry(this_00);
      QScreenPrivate::UpdateEmitter::~UpdateEmitter(&updateEmitter);
      QGuiApplication::allWindows();
      iVar6 = QList<QWindow_*>::begin((QList<QWindow_*> *)&updateEmitter);
      iVar7 = QList<QWindow_*>::end((QList<QWindow_*> *)&updateEmitter);
      for (; iVar6.i != iVar7.i; iVar6.i = iVar6.i + 1) {
        this_01 = *iVar6.i;
        pQVar8 = &QWindow::screen(this_01)->super_QObject;
        pDVar2 = (this->wp).d;
        if ((pDVar2 == (Data *)0x0) ||
           ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
          pQVar10 = (QObject *)0x0;
        }
        else {
          pQVar10 = (e->screen).wp.value;
        }
        if (pQVar10 == pQVar8) {
          QWindowPrivate::updateDevicePixelRatio(*(QWindowPrivate **)&this_01->field_0x8);
        }
      }
      QArrayDataPointer<QWindow_*>::~QArrayDataPointer
                ((QArrayDataPointer<QWindow_*> *)&updateEmitter);
      m_maxDevicePixelRatio = 0.0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGuiApplicationPrivate::processScreenLogicalDotsPerInchChange(QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent *e)
{
    // This operation only makes sense after the QGuiApplication constructor runs
    if (QCoreApplication::startingUp())
        return;

    QHighDpiScaling::updateHighDpiScaling();

    if (!e->screen)
        return;

    {
        QScreen *s = e->screen.data();
        QScreenPrivate::UpdateEmitter updateEmitter(s);
        s->d_func()->logicalDpi = QDpi(e->dpiX, e->dpiY);
        s->d_func()->updateGeometry();
    }

    for (QWindow *window : QGuiApplication::allWindows())
        if (window->screen() == e->screen)
            QWindowPrivate::get(window)->updateDevicePixelRatio();

    resetCachedDevicePixelRatio();
}